

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_single.hpp
# Opt level: O3

shared_ptr<IC> __thiscall Infector::Container::buildSingle_delegate<IC>(Container *this)

{
  long *plVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  __buckets_ptr pp_Var5;
  undefined8 uVar6;
  undefined8 *puVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *in_RSI;
  pointer_____offset_0x10___ *ppuVar9;
  shared_ptr<IC> sVar10;
  key_type local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  local_38._M_target = (type_info *)&IC::typeinfo;
  iVar2 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(in_RSI + 1),&local_38);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
      ._M_cur == (__node_type *)0x0) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = &PTR__exception_001817c8;
    ppuVar9 = &ExBuildWhat::typeinfo;
  }
  else if (*(char *)((long)iVar2.
                           super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                           ._M_cur + 0x18) == '\0') {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = &PTR__exception_00181808;
    ppuVar9 = &ExSingleMulti::typeinfo;
  }
  else {
    iVar3 = std::
            _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(in_RSI + 2),
                   (key_type *)
                   ((long)iVar2.
                          super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                          ._M_cur + 0x10));
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      iVar4 = std::
              _Hashtable<std::type_index,_std::pair<const_std::type_index,_Infector::IAnyShared_*>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(in_RSI,(key_type *)
                            ((long)iVar2.
                                   super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                                   ._M_cur + 0x10));
      plVar1 = *(long **)((long)iVar4.
                                super__Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false>
                                ._M_cur + 0x10);
      pp_Var5 = (__buckets_ptr)(**(code **)*plVar1)(plVar1,&IC::typeinfo);
      if (pp_Var5 == (__buckets_ptr)0x0) {
        local_38._M_target = (type_info *)0x0;
        if (*(long *)((long)iVar3.
                            super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
                            ._M_cur + 0x20) == 0) {
          std::__throw_bad_function_call();
        }
        uVar6 = (**(code **)((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
                                   ._M_cur + 0x28))
                          ((long)iVar3.
                                 super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
                                 ._M_cur + 0x10,&local_38);
        (**(code **)(*plVar1 + 8))(plVar1,uVar6);
        pp_Var5 = (__buckets_ptr)(**(code **)*plVar1)(plVar1,&IC::typeinfo);
        if (pp_Var5 == (__buckets_ptr)0x0) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = &PTR__exception_00181db8;
          ppuVar9 = &ExAnySharedNullPtr::typeinfo;
          goto LAB_00161d20;
        }
      }
      (**(code **)(*plVar1 + 0x10))(&local_38,plVar1);
      _Var8._M_pi = extraout_RDX;
      if (local_30 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (this->singleIstances)._M_h._M_buckets = pp_Var5;
        (this->singleIstances)._M_h._M_bucket_count = 0;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_30->_M_use_count = local_30->_M_use_count + 1;
          UNLOCK();
          (this->singleIstances)._M_h._M_buckets = pp_Var5;
          (this->singleIstances)._M_h._M_bucket_count = (size_type)local_30;
          if (local_30 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00161c47;
        }
        else {
          local_30->_M_use_count = local_30->_M_use_count + 1;
          (this->singleIstances)._M_h._M_buckets = pp_Var5;
          (this->singleIstances)._M_h._M_bucket_count = (size_type)local_30;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
        _Var8._M_pi = extraout_RDX_00;
      }
LAB_00161c47:
      sVar10.super___shared_ptr<IC,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
      sVar10.super___shared_ptr<IC,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
      return (shared_ptr<IC>)sVar10.super___shared_ptr<IC,_(__gnu_cxx::_Lock_policy)2>;
    }
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = &PTR__exception_00181848;
    ppuVar9 = &ExNotWired::typeinfo;
  }
LAB_00161d20:
  __cxa_throw(puVar7,ppuVar9,std::exception::~exception);
}

Assistant:

std::shared_ptr<T> Container::buildSingle_delegate(){
        auto it = typeMap.find( std::type_index(typeid(T)) );
        if( it==typeMap.end()) //"it" is concrete type, T abstract one
            launch_exception<ExBuildWhat>(); // TYPE NOT REGISTERED

        if( it->second.single == false)
            launch_exception<ExSingleMulti>(); // T must be single

        //at this point may happen that concrete type and abstract ones are the
        //same.that's ok. (bindSingleAsNothing)
        auto it2 = callbacks.find(  it->second.type ); //find constructor

        if( it2==callbacks.end())
            launch_exception<ExNotWired>(); // CONSTRUCTOR NOT WIRED

        auto it3 = singleIstances.find( it->second.type );

        IAnyShared * any = it3->second;
        T* myPointer = reinterpret_cast<T*>(
                                    any->getPtr(std::type_index(typeid(T)))
                                            );
        if(myPointer==nullptr){
            try{
                any->setPtr( (it2->second)(nullptr) );
                myPointer =  reinterpret_cast<T*>(
                                    any->getPtr(std::type_index(typeid(T)))
                                            );

            }catch(std::exception & ex){
                throw ex;
            }catch(...){
                launch_exception<ExUnkownException>();
            }
        }

        if(myPointer == nullptr)
                launch_exception<ExAnySharedNullPtr>();

        return std::move(std::shared_ptr<T> (
                                any->getReferenceCounter(),
                                myPointer ));
    }